

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O2

CharOp * __thiscall xercesc_4_0::OpFactory::createCharOp(OpFactory *this,XMLInt32 data)

{
  CharOp *this_00;
  
  this_00 = (CharOp *)XMemory::operator_new(0x28,this->fMemoryManager);
  CharOp::CharOp(this_00,O_CHAR,data,this->fMemoryManager);
  BaseRefVectorOf<xercesc_4_0::Op>::addElement
            (&this->fOpVector->super_BaseRefVectorOf<xercesc_4_0::Op>,(Op *)this_00);
  return this_00;
}

Assistant:

CharOp* OpFactory::createCharOp(XMLInt32 data) {

    CharOp* tmpOp = new (fMemoryManager) CharOp(Op::O_CHAR, data, fMemoryManager);

    fOpVector->addElement(tmpOp);
    return tmpOp;
}